

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,NamespaceAliasDeclaration *o)

{
  if ((o->targetNamespace).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  if ((o->specialisationArgs).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
    return;
  }
  return;
}

Assistant:

virtual void visit (AST::NamespaceAliasDeclaration& o)
    {
        visitObjectIfNotNull (o.targetNamespace);
        visitObjectIfNotNull (o.specialisationArgs);
    }